

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void r_code::Utils::SetTimestamp(Code *object,uint16_t index,uint64_t t)

{
  Atom *pAVar1;
  Atom local_3c;
  Atom local_38 [5];
  Atom local_24;
  undefined8 local_20;
  uint64_t t_local;
  Code *pCStack_10;
  uint16_t index_local;
  Code *object_local;
  
  local_20 = t;
  t_local._6_2_ = index;
  pCStack_10 = object;
  Atom::Timestamp();
  pAVar1 = (Atom *)(**(code **)(*(long *)pCStack_10 + 0x20))(pCStack_10,t_local._6_2_);
  Atom::operator=(pAVar1,&local_24);
  Atom::~Atom(&local_24);
  Atom::Atom(local_38,local_20._4_4_);
  t_local._6_2_ = t_local._6_2_ + 1;
  pAVar1 = (Atom *)(**(code **)(*(long *)pCStack_10 + 0x20))(pCStack_10,t_local._6_2_);
  Atom::operator=(pAVar1,local_38);
  Atom::~Atom(local_38);
  Atom::Atom(&local_3c,(uint32_t)local_20);
  t_local._6_2_ = t_local._6_2_ + 1;
  pAVar1 = (Atom *)(**(code **)(*(long *)pCStack_10 + 0x20))(pCStack_10,t_local._6_2_);
  Atom::operator=(pAVar1,&local_3c);
  Atom::~Atom(&local_3c);
  return;
}

Assistant:

void Utils::SetTimestamp(Code *object, uint16_t index, uint64_t t)
{
    object->code(index) = Atom::Timestamp();
    object->code(++index) = Atom(t >> 32);
    object->code(++index) = Atom(t & UINT32_MAX);
}